

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::EmbedVideo::EmbedVideo(EmbedVideo *this,EmbedVideo *param_1)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  pointer *__ptr;
  
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->url).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->proxy_url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->proxy_url).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->proxy_url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  _Var1._M_head_impl =
       (param_1->height).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl == (int *)0x0) {
    (this->height).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var2._M_head_impl = (int *)0x0;
  }
  else {
    _Var2._M_head_impl = (int *)operator_new(4);
    *_Var2._M_head_impl = *_Var1._M_head_impl;
  }
  (this->height).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
  .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  (this->height).super_field<int>.s_ = (param_1->height).super_field<int>.s_;
  (this->height)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var1._M_head_impl =
       (param_1->width).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl == (int *)0x0) {
    (this->width).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var2._M_head_impl = (int *)0x0;
  }
  else {
    _Var2._M_head_impl = (int *)operator_new(4);
    *_Var2._M_head_impl = *_Var1._M_head_impl;
  }
  (this->width).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  (this->width).super_field<int>.s_ = (param_1->width).super_field<int>.s_;
  (this->width)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  return;
}

Assistant:

EmbedVideo(
        omittable_field<std::string> url = omitted,
        omittable_field<std::string> proxy_url = omitted,
        omittable_field<int> height = omitted,
        omittable_field<int> width = omitted
    ):
        url(url),
        proxy_url(proxy_url),
        height(height),
        width(width)
    {}